

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O2

void __thiscall CJsonWriter::WriteIndent(CJsonWriter *this,bool EndElement)

{
  CState *pCVar1;
  int i;
  int iVar2;
  
  if ((this->m_NumStates != 0) && (pCVar1 = TopState(this), pCVar1->m_Kind != '\x03')) {
    pCVar1 = TopState(this);
    if (!EndElement && pCVar1->m_Empty == false) {
      WriteInternal(this,",");
    }
    io_write_newline(this->m_IO);
    for (iVar2 = 0; iVar2 < this->m_Indentation; iVar2 = iVar2 + 1) {
      WriteInternal(this,"\t");
    }
    return;
  }
  if (!EndElement) {
    return;
  }
  io_write_newline(this->m_IO);
  return;
}

Assistant:

void CJsonWriter::WriteIndent(bool EndElement)
{
	const bool NotRootOrAttribute = m_NumStates != 0
		&& TopState()->m_Kind != STATE_ATTRIBUTE;

	if(NotRootOrAttribute && !TopState()->m_Empty && !EndElement)
		WriteInternal(",");

	if(NotRootOrAttribute || EndElement)
		io_write_newline(m_IO);

	if(NotRootOrAttribute)
		for(int i = 0; i < m_Indentation; i++)
			WriteInternal("\t");
}